

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestStringToDoubleFloatWhitespace(void)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  float fVar4;
  undefined4 uVar5;
  double dVar6;
  int processed;
  char kWhitespaceAscii [23];
  uc16 kWhitespace16 [76];
  bool local_fd;
  int local_fc;
  char local_f8 [32];
  StringToDoubleConverter local_d8;
  uc16 local_a8 [80];
  
  builtin_strncpy(local_f8,"\n\r\t\v\f -\n\r\t\v\f 1.2\n\r\t\v\f ",0x17);
  dVar6 = StrToD(local_f8,0x38,NAN,&local_fc,&local_fd,0);
  if ((dVar6 != -1.2) || (NAN(dVar6))) {
    pcVar1 = "-1.2";
    pcVar3 = "StrToD(kWhitespaceAscii, flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x33333333;
    uVar2 = 0x15e1;
LAB_0085e798:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar5,dVar6,
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,pcVar1,pcVar3);
    abort();
  }
  if (local_fd == false) {
    uVar2 = 0x15e2;
  }
  else {
    dVar6 = StrToF(local_f8,0x38,NAN,&local_fc,&local_fd);
    if ((dVar6 != -1.2000000476837158) || (NAN(dVar6))) {
      pcVar1 = "-1.2f";
      pcVar3 = "StrToF(kWhitespaceAscii, flags, Double::NaN(), &processed, &all_used)";
      uVar5 = 0x40000000;
      uVar2 = 0x15e4;
      goto LAB_0085e798;
    }
    if (local_fd == false) {
      uVar2 = 0x15e5;
    }
    else {
      memcpy(local_a8,&DAT_00c43040,0x98);
      local_d8.flags_ = 0x38;
      local_d8.empty_string_value_ = NAN;
      local_d8.junk_string_value_ = NAN;
      local_d8.infinity_symbol_ = (char *)0x0;
      local_d8.nan_symbol_ = (char *)0x0;
      local_d8.separator_ = 0;
      dVar6 = double_conversion::StringToDoubleConverter::StringToDouble
                        (&local_d8,local_a8,0x4c,&local_fc);
      if ((dVar6 != -1.2) || (NAN(dVar6))) {
        pcVar1 = "-1.2";
        pcVar3 = 
        "StrToD16(kWhitespace16, kWhitespace16Length, flags, Double::NaN(), &processed, &all_used)";
        uVar5 = 0x33333333;
        uVar2 = 0x160e;
        goto LAB_0085e798;
      }
      if (local_fc == 0x4c) {
        local_d8.flags_ = 0x38;
        local_d8.empty_string_value_ = NAN;
        local_d8.junk_string_value_ = NAN;
        local_d8.infinity_symbol_ = (char *)0x0;
        local_d8.nan_symbol_ = (char *)0x0;
        local_d8.separator_ = 0;
        fVar4 = double_conversion::StringToDoubleConverter::StringToFloat
                          (&local_d8,local_a8,0x4c,&local_fc);
        if ((fVar4 != -1.2) || (NAN(fVar4))) {
          dVar6 = (double)fVar4;
          pcVar1 = "-1.2f";
          pcVar3 = 
          "StrToF16(kWhitespace16, kWhitespace16Length, flags, Single::NaN(), &processed, &all_used)"
          ;
          uVar5 = 0x40000000;
          uVar2 = 0x1612;
          goto LAB_0085e798;
        }
        if (local_fc == 0x4c) {
          return;
        }
        uVar2 = 0x1613;
      }
      else {
        uVar2 = 0x160f;
      }
    }
  }
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar2,"all_used");
  abort();
}

Assistant:

TEST(StringToDoubleFloatWhitespace) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;

  const char kWhitespaceAscii[] = {
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    '-',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    '1', '.', '2',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    0x00
  };
  CHECK_EQ(-1.2, StrToD(kWhitespaceAscii, flags, Double::NaN(),
                        &processed, &all_used));
  CHECK(all_used);
  CHECK_EQ(-1.2f, StrToF(kWhitespaceAscii, flags, Double::NaN(),
                         &processed, &all_used));
  CHECK(all_used);

  const uc16 kOghamSpaceMark = 0x1680;
  const uc16 kMongolianVowelSeparator = 0x180E;
  const uc16 kEnQuad = 0x2000;
  const uc16 kEmQuad = 0x2001;
  const uc16 kEnSpace = 0x2002;
  const uc16 kEmSpace = 0x2003;
  const uc16 kThreePerEmSpace = 0x2004;
  const uc16 kFourPerEmSpace = 0x2005;
  const uc16 kSixPerEmSpace = 0x2006;
  const uc16 kFigureSpace = 0x2007;
  const uc16 kPunctuationSpace = 0x2008;
  const uc16 kThinSpace = 0x2009;
  const uc16 kHairSpace = 0x200A;
  const uc16 kNarrowNoBreakSpace = 0x202F;
  const uc16 kMediumMathematicalSpace = 0x205F;
  const uc16 kIdeographicSpace = 0x3000;

  const uc16 kWhitespace16[] = {
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
    '-',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
    '1', '.', '2',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
  };
  const int kWhitespace16Length = DOUBLE_CONVERSION_ARRAY_SIZE(kWhitespace16);
  CHECK_EQ(-1.2, StrToD16(kWhitespace16, kWhitespace16Length, flags,
                          Double::NaN(),
                          &processed, &all_used));
  CHECK(all_used);
  CHECK_EQ(-1.2f, StrToF16(kWhitespace16, kWhitespace16Length, flags,
                           Single::NaN(),
                           &processed, &all_used));
  CHECK(all_used);
}